

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O0

bool __thiscall Js::RecyclableObject::IsWritableDataOnlyDetectionBitSet(RecyclableObject *this)

{
  bool bVar1;
  TypeId typeId;
  DynamicObject *this_00;
  DynamicTypeHandler *this_01;
  ArrayObject *this_02;
  undefined1 local_2a;
  undefined1 local_29;
  DynamicObject *obj;
  RecyclableObject *this_local;
  
  typeId = GetTypeId(this);
  bVar1 = DynamicType::Is(typeId);
  if (bVar1) {
    this_00 = UnsafeVarTo<Js::DynamicObject,Js::RecyclableObject>(this);
    this_01 = DynamicObject::GetTypeHandler(this_00);
    bVar1 = DynamicTypeHandler::IsWritableDataOnlyDetectionBitSet(this_01);
    local_29 = true;
    if (!bVar1) {
      bVar1 = DynamicObject::HasObjectArray(this_00);
      local_2a = false;
      if (bVar1) {
        this_02 = DynamicObject::GetObjectArrayOrFlagsAsArray(this_00);
        local_2a = IsWritableDataOnlyDetectionBitSet((RecyclableObject *)this_02);
      }
      local_29 = local_2a;
    }
    this_local._7_1_ = local_29;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RecyclableObject::IsWritableDataOnlyDetectionBitSet()
    {
        if (DynamicType::Is(this->GetTypeId()))
        {
            DynamicObject* obj = UnsafeVarTo<DynamicObject>(this);
            return obj->GetTypeHandler()->IsWritableDataOnlyDetectionBitSet() ||
                (obj->HasObjectArray() && obj->GetObjectArrayOrFlagsAsArray()->IsWritableDataOnlyDetectionBitSet());
        }

        return false;
    }